

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutNode.c
# Opt level: O2

Cut_Cut_t *
Cut_NodeComputeCuts(Cut_Man_t *p,int Node,int Node0,int Node1,int fCompl0,int fCompl1,int fTriv,
                   int TreeCode)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  Vec_Ptr_t *p_00;
  int iVar3;
  int iVar4;
  Cut_Cut_t *pCVar5;
  abctime aVar6;
  Cut_Cut_t *pCVar7;
  abctime aVar8;
  int *piVar9;
  Cut_Params_t *pCVar10;
  long lVar11;
  Vec_Ptr_t **ppVVar12;
  Cut_Cut_t *pCVar13;
  Cut_Cut_t *pCut1;
  int iVar14;
  int nCapMin;
  uint uVar15;
  Cut_List_t Super;
  
  p->nNodes = p->nNodes + 1;
  p->nNodeCuts = 0;
  if (p->pParams->fRecord != 0) {
    pCVar5 = Cut_NodeReadCutsNew(p,Node0);
    Cut_CutNumberList(pCVar5);
    pCVar5 = Cut_NodeReadCutsNew(p,Node1);
    Cut_CutNumberList(pCVar5);
  }
  aVar6 = Abc_Clock();
  Cut_ListStart(&Super);
  pCVar5 = Cut_NodeReadCutsNew(p,Node0);
  pCVar7 = Cut_NodeReadCutsNew(p,Node1);
  Cut_NodeDoComputeCuts(p,&Super,Node,fCompl0,fCompl1,pCVar5,pCVar7,fTriv,TreeCode);
  pCVar5 = Cut_ListFinish(&Super);
  aVar8 = Abc_Clock();
  p->timeMerge = p->timeMerge + (aVar8 - aVar6);
  pCVar10 = p->pParams;
  if (pCVar10->fRecord != 0) {
    Vec_IntWriteEntry(p->vNodeStarts,Node,p->vCutPairs->nSize);
    for (pCVar7 = pCVar5; pCVar7 != (Cut_Cut_t *)0x0; pCVar7 = pCVar7->pNext) {
      pVVar2 = p->vCutPairs;
      uVar1 = *(uint *)pCVar7;
      iVar4 = pVVar2->nSize;
      if (iVar4 == pVVar2->nCap) {
        uVar15 = iVar4 * 2;
        if (iVar4 < 0x10) {
          uVar15 = 0x10;
        }
        if (iVar4 < (int)uVar15) {
          if (pVVar2->pArray == (int *)0x0) {
            piVar9 = (int *)malloc((ulong)uVar15 << 2);
          }
          else {
            piVar9 = (int *)realloc(pVVar2->pArray,(ulong)uVar15 << 2);
          }
          pVVar2->pArray = piVar9;
          if (piVar9 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          pVVar2->nCap = uVar15;
          iVar4 = pVVar2->nSize;
        }
      }
      pVVar2->nSize = iVar4 + 1;
      pVVar2->pArray[iVar4] = uVar1 & 0x7ff | (uVar1 & 0x3ff800) << 5;
    }
    iVar4 = p->vCutPairs->nSize;
    pVVar2 = p->vNodeCuts;
    iVar3 = Vec_IntEntry(p->vNodeStarts,Node);
    Vec_IntWriteEntry(pVVar2,Node,iVar4 - iVar3);
    pCVar10 = p->pParams;
  }
  pCVar7 = pCVar5;
  if (pCVar10->fRecordAig != 0) {
    for (; pCVar7 != (Cut_Cut_t *)0x0; pCVar7 = pCVar7->pNext) {
      uVar1 = *(uint *)pCVar7;
      if (0x4fffffff < uVar1) {
        Aig_RManRecord((uint *)((long)&pCVar7[1].field_0x0 + (ulong)(uVar1 >> 0x16 & 0x3c)),
                       uVar1 >> 0x1c);
      }
    }
    pCVar10 = p->pParams;
  }
  if (p->nNodeCuts == pCVar10->nKeepMax) {
    p->nCutsLimit = p->nCutsLimit + 1;
  }
  p_00 = p->vCutsNew;
  iVar4 = p_00->nSize;
  if (iVar4 <= Node) {
    iVar14 = Node + 1;
    iVar3 = p_00->nCap * 2;
    nCapMin = iVar14;
    if ((iVar3 <= Node) || (nCapMin = iVar3, p_00->nCap <= Node)) {
      Vec_PtrGrow(p_00,nCapMin);
      iVar4 = p_00->nSize;
    }
    for (lVar11 = (long)iVar4; lVar11 < iVar14; lVar11 = lVar11 + 1) {
      p_00->pArray[lVar11] = (void *)0x0;
    }
    p_00->nSize = iVar14;
  }
  pCVar7 = Cut_NodeReadCutsNew(p,Node);
  if (pCVar7 == (Cut_Cut_t *)0x0) {
    Cut_NodeWriteCutsNew(p,Node,pCVar5);
    aVar6 = Abc_Clock();
    if ((p->pParams->fMap != 0) && (p->pParams->fSeq == 0)) {
      iVar4 = Vec_IntEntry(p->vDelays2,Node0);
      iVar3 = Vec_IntEntry(p->vDelays2,Node1);
      ppVVar12 = &p->vCutsMax;
      if (iVar4 == 0) {
        ppVVar12 = &p->vCutsNew;
      }
      pCVar7 = (Cut_Cut_t *)Vec_PtrEntry(*ppVVar12,Node0);
      ppVVar12 = &p->vCutsMax;
      if (iVar3 == 0) {
        ppVVar12 = &p->vCutsNew;
      }
      pCVar13 = (Cut_Cut_t *)Vec_PtrEntry(*ppVVar12,Node1);
      if (iVar4 == iVar3) {
        iVar4 = iVar4 + (uint)(iVar4 == 0);
      }
      else if (iVar3 < iVar4) {
        pCVar13 = (Cut_Cut_t *)Vec_PtrEntry(p->vCutsNew,Node1);
        if (((undefined1  [24])*pCVar13 & (undefined1  [24])0xf0000000) !=
            (undefined1  [24])0x10000000) {
          __assert_fail("pCut1->nLeaves == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutNode.c"
                        ,0x1f8,"int Cut_NodeMapping(Cut_Man_t *, Cut_Cut_t *, int, int, int)");
        }
      }
      else {
        pCVar7 = (Cut_Cut_t *)Vec_PtrEntry(p->vCutsNew,Node0);
        iVar4 = iVar3;
        if (((undefined1  [24])*pCVar7 & (undefined1  [24])0xf0000000) !=
            (undefined1  [24])0x10000000) {
          __assert_fail("pCut0->nLeaves == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutNode.c"
                        ,0x1fe,"int Cut_NodeMapping(Cut_Man_t *, Cut_Cut_t *, int, int, int)");
        }
      }
      pCut1 = pCVar13;
      if (*(uint *)pCVar7 >> 0x1c < *(uint *)pCVar13 >> 0x1c) {
        pCut1 = pCVar7;
        pCVar7 = pCVar13;
      }
      pCVar7 = Cut_CutMergeTwo(p,pCVar7,pCut1);
      if (pCVar7 == (Cut_Cut_t *)0x0) {
        iVar4 = iVar4 + 1;
        pCVar7 = Cut_CutAlloc(p);
        *(uint *)pCVar7 = *(uint *)pCVar7 & 0xfffffff | 0x20000000;
        iVar3 = Node1;
        if (Node0 < Node1) {
          iVar3 = Node0;
        }
        *(int *)(pCVar7 + 1) = iVar3;
        if (Node1 < Node0) {
          Node1 = Node0;
        }
        pCVar7[1].uSign = Node1;
      }
      if (iVar4 < 1) {
        __assert_fail("Delay > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutNode.c"
                      ,0x20d,"int Cut_NodeMapping(Cut_Man_t *, Cut_Cut_t *, int, int, int)");
      }
      Vec_IntWriteEntry(p->vDelays2,Node,iVar4);
      Vec_PtrWriteEntry(p->vCutsMax,Node,pCVar7);
      if (p->nDelayMin < iVar4) {
        p->nDelayMin = iVar4;
      }
    }
    aVar8 = Abc_Clock();
    p->timeMap = p->timeMap + (aVar8 - aVar6);
    return pCVar5;
  }
  __assert_fail("Cut_NodeReadCutsNew(p, Node) == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutNode.c"
                ,0x19b,
                "Cut_Cut_t *Cut_NodeComputeCuts(Cut_Man_t *, int, int, int, int, int, int, int)");
}

Assistant:

Cut_Cut_t * Cut_NodeComputeCuts( Cut_Man_t * p, int Node, int Node0, int Node1, int fCompl0, int fCompl1, int fTriv, int TreeCode )
{
    Cut_List_t Super, * pSuper = &Super;
    Cut_Cut_t * pList, * pCut;
    abctime clk;
    // start the number of cuts at the node
    p->nNodes++;
    p->nNodeCuts = 0;
    // prepare information for recording
    if ( p->pParams->fRecord )
    {
        Cut_CutNumberList( Cut_NodeReadCutsNew(p, Node0) );
        Cut_CutNumberList( Cut_NodeReadCutsNew(p, Node1) );
    }
    // compute the cuts
clk = Abc_Clock();
    Cut_ListStart( pSuper );
    Cut_NodeDoComputeCuts( p, pSuper, Node, fCompl0, fCompl1, Cut_NodeReadCutsNew(p, Node0), Cut_NodeReadCutsNew(p, Node1), fTriv, TreeCode );
    pList = Cut_ListFinish( pSuper );
p->timeMerge += Abc_Clock() - clk;
    // verify the result of cut computation
//    Cut_CutListVerify( pList );
    // performing the recording
    if ( p->pParams->fRecord )
    {
        Vec_IntWriteEntry( p->vNodeStarts, Node, Vec_IntSize(p->vCutPairs) );
        Cut_ListForEachCut( pList, pCut )
            Vec_IntPush( p->vCutPairs, ((pCut->Num1 << 16) | pCut->Num0) );
        Vec_IntWriteEntry( p->vNodeCuts, Node, Vec_IntSize(p->vCutPairs) - Vec_IntEntry(p->vNodeStarts, Node) );
    }
    if ( p->pParams->fRecordAig )
    {
        extern void Aig_RManRecord( unsigned * pTruth, int nVarsInit );
        Cut_ListForEachCut( pList, pCut )
            if ( Cut_CutReadLeaveNum(pCut) > 4 )
                Aig_RManRecord( Cut_CutReadTruth(pCut), Cut_CutReadLeaveNum(pCut) );
    }
    // check if the node is over the list
    if ( p->nNodeCuts == p->pParams->nKeepMax )
        p->nCutsLimit++;
    // set the list at the node
    Vec_PtrFillExtra( p->vCutsNew, Node + 1, NULL );
    assert( Cut_NodeReadCutsNew(p, Node) == NULL );
    /////
//    pList->pNext = NULL;
    /////
    Cut_NodeWriteCutsNew( p, Node, pList );
    // filter the cuts
//clk = Abc_Clock();
//    if ( p->pParams->fFilter )
//        Cut_CutFilter( p, pList0 );
//p->timeFilter += Abc_Clock() - clk;
    // perform mapping of this node with these cuts
clk = Abc_Clock();
    if ( p->pParams->fMap && !p->pParams->fSeq )
    {
//        int Delay1, Delay2;
//        Delay1 = Cut_NodeMapping( p, pList, Node, Node0, Node1 );    
//        Delay2 = Cut_NodeMapping2( p, pList, Node, Node0, Node1 );   
//        assert( Delay1 >= Delay2 );
        Cut_NodeMapping( p, pList, Node, Node0, Node1 );
    }
p->timeMap += Abc_Clock() - clk;
    return pList;
}